

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transmitter_PDU::SetModulationParameters(Transmitter_PDU *this,KOCTET *MP,KUINT8 Length)

{
  KUINT16 *pKVar1;
  pointer pcVar2;
  pointer pcVar3;
  byte bVar4;
  KUINT8 KVar5;
  bool bVar6;
  char local_29;
  
  pcVar2 = (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + ((short)pcVar2 - (short)pcVar3);
  if (pcVar2 != pcVar3) {
    (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar2;
  }
  KVar5 = Length;
  while (bVar6 = KVar5 != '\0', KVar5 = KVar5 + 0xff, bVar6) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vModulationParams,MP);
    MP = MP + 1;
  }
  if ((Length & 7) != 0) {
    for (bVar4 = Length & 7 | 0xf8; bVar4 != 0; bVar4 = bVar4 + 1) {
      local_29 = '\0';
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                (&this->m_vModulationParams,&local_29);
    }
  }
  bVar4 = (char)(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (char)(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->m_ui8LengthOfModulationParam = bVar4;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (ushort)bVar4;
  return;
}

Assistant:

void Transmitter_PDU::SetModulationParameters( const KOCTET * MP, KUINT8 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength -= m_vModulationParams.size();
    m_vModulationParams.clear();

    // Copy data into the vector
    for( KUINT8 i = 0; i < Length; ++i, ++MP )
    {
        m_vModulationParams.push_back( *MP );
    }

    // Check if we need to add any padding, the length should be a
    // multiple of 8.
    KUINT8 ui8PaddingNeeded = ( Length % 8 == 0 ? 0 : ( 8 - Length % 8 ) );

    // Add the padding, if needed.
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vModulationParams.push_back( 0 );
    }

    // Update length
    m_ui8LengthOfModulationParam = m_vModulationParams.size();
    m_ui16PDULength += m_ui8LengthOfModulationParam;
}